

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QMovableArrayOps<Symbol>::emplace<Symbol>
          (QMovableArrayOps<Symbol> *this,qsizetype i,Symbol *args)

{
  Symbol **ppSVar1;
  Symbol *pSVar2;
  qsizetype *pqVar3;
  undefined4 uVar4;
  long lVar5;
  Data *pDVar6;
  Symbol *pSVar7;
  undefined4 uVar11;
  Data *pDVar8;
  char *pcVar9;
  qsizetype qVar10;
  undefined4 uVar12;
  undefined4 uVar13;
  qsizetype qVar14;
  qsizetype qVar15;
  Token TVar16;
  long in_FS_OFFSET;
  bool bVar17;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  
  lVar5 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar6 = (this->super_QGenericArrayOps<Symbol>).super_QArrayDataPointer<Symbol>.d;
  if ((pDVar6 == (Data *)0x0) ||
     (1 < (__int_type)(pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int>)) {
LAB_001364b9:
    uVar4 = args->lineNum;
    uVar11 = args->token;
    pDVar8 = (args->lex).d.d;
    (args->lex).d.d = (Data *)0x0;
    pcVar9 = (args->lex).d.ptr;
    qVar10 = (args->lex).d.size;
    (args->lex).d.ptr = (char *)0x0;
    (args->lex).d.size = 0;
    qVar14 = args->from;
    qVar15 = args->len;
    bVar17 = (this->super_QGenericArrayOps<Symbol>).super_QArrayDataPointer<Symbol>.size != 0;
    QArrayDataPointer<Symbol>::detachAndGrow
              ((QArrayDataPointer<Symbol> *)this,(uint)(i == 0 && bVar17),1,(Symbol **)0x0,
               (QArrayDataPointer<Symbol> *)0x0);
    pSVar7 = (this->super_QGenericArrayOps<Symbol>).super_QArrayDataPointer<Symbol>.ptr;
    local_48 = (undefined4)qVar14;
    uStack_44 = (undefined4)((ulong)qVar14 >> 0x20);
    uStack_40 = (undefined4)qVar15;
    uStack_3c = (undefined4)((ulong)qVar15 >> 0x20);
    if (i != 0 || !bVar17) {
      pSVar2 = pSVar7 + i;
      memmove(pSVar2 + 1,pSVar7 + i,
              ((this->super_QGenericArrayOps<Symbol>).super_QArrayDataPointer<Symbol>.size - i) *
              0x30);
      pSVar2->lineNum = uVar4;
      pSVar2->token = uVar11;
      (pSVar2->lex).d.d = pDVar8;
      (pSVar2->lex).d.ptr = pcVar9;
      (pSVar2->lex).d.size = qVar10;
      *(undefined4 *)&pSVar2->from = local_48;
      *(undefined4 *)((long)&pSVar2->from + 4) = uStack_44;
      *(undefined4 *)&pSVar2->len = uStack_40;
      *(undefined4 *)((long)&pSVar2->len + 4) = uStack_3c;
      goto LAB_00136588;
    }
    pSVar7[-1].lineNum = uVar4;
    pSVar7[-1].token = uVar11;
    pSVar7[-1].lex.d.d = pDVar8;
    pSVar7[-1].lex.d.ptr = pcVar9;
    pSVar7[-1].lex.d.size = qVar10;
    *(undefined4 *)&pSVar7[-1].from = local_48;
    *(undefined4 *)((long)&pSVar7[-1].from + 4) = uStack_44;
    *(undefined4 *)&pSVar7[-1].len = uStack_40;
    *(undefined4 *)((long)&pSVar7[-1].len + 4) = uStack_3c;
  }
  else {
    if (((this->super_QGenericArrayOps<Symbol>).super_QArrayDataPointer<Symbol>.size == i) &&
       (pSVar7 = (this->super_QGenericArrayOps<Symbol>).super_QArrayDataPointer<Symbol>.ptr,
       (pDVar6->super_QArrayData).alloc - i !=
       ((long)((long)pSVar7 -
              ((ulong)((long)&pDVar6[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)) >> 4) *
       -0x5555555555555555)) {
      TVar16 = args->token;
      pSVar7[i].lineNum = args->lineNum;
      pSVar7[i].token = TVar16;
      pDVar8 = (args->lex).d.d;
      (args->lex).d.d = (Data *)0x0;
      pSVar7[i].lex.d.d = pDVar8;
      pcVar9 = (args->lex).d.ptr;
      (args->lex).d.ptr = (char *)0x0;
      pSVar7[i].lex.d.ptr = pcVar9;
      qVar10 = (args->lex).d.size;
      (args->lex).d.size = 0;
      pSVar7[i].lex.d.size = qVar10;
      uVar12 = *(undefined4 *)((long)&args->from + 4);
      qVar10 = args->len;
      uVar13 = *(undefined4 *)((long)&args->len + 4);
      pqVar3 = &pSVar7[i].from;
      *(int *)pqVar3 = (int)args->from;
      *(undefined4 *)((long)pqVar3 + 4) = uVar12;
      *(int *)(pqVar3 + 1) = (int)qVar10;
      *(undefined4 *)((long)pqVar3 + 0xc) = uVar13;
      goto LAB_00136588;
    }
    if ((i != 0) ||
       (pSVar7 = (this->super_QGenericArrayOps<Symbol>).super_QArrayDataPointer<Symbol>.ptr,
       (Symbol *)((ulong)((long)&pDVar6[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0) ==
       pSVar7)) goto LAB_001364b9;
    TVar16 = args->token;
    pSVar7[-1].lineNum = args->lineNum;
    pSVar7[-1].token = TVar16;
    pDVar8 = (args->lex).d.d;
    (args->lex).d.d = (Data *)0x0;
    pSVar7[-1].lex.d.d = pDVar8;
    pcVar9 = (args->lex).d.ptr;
    (args->lex).d.ptr = (char *)0x0;
    pSVar7[-1].lex.d.ptr = pcVar9;
    qVar10 = (args->lex).d.size;
    (args->lex).d.size = 0;
    pSVar7[-1].lex.d.size = qVar10;
    uVar12 = *(undefined4 *)((long)&args->from + 4);
    qVar10 = args->len;
    uVar13 = *(undefined4 *)((long)&args->len + 4);
    *(int *)&pSVar7[-1].from = (int)args->from;
    *(undefined4 *)((long)&pSVar7[-1].from + 4) = uVar12;
    *(int *)&pSVar7[-1].len = (int)qVar10;
    *(undefined4 *)((long)&pSVar7[-1].len + 4) = uVar13;
  }
  ppSVar1 = &(this->super_QGenericArrayOps<Symbol>).super_QArrayDataPointer<Symbol>.ptr;
  *ppSVar1 = *ppSVar1 + -1;
LAB_00136588:
  pqVar3 = &(this->super_QGenericArrayOps<Symbol>).super_QArrayDataPointer<Symbol>.size;
  *pqVar3 = *pqVar3 + 1;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar5) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }